

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  fiat_uint1 local_b9;
  uint64_t uStack_b8;
  fiat_uint1 x20;
  uint64_t x19;
  uint64_t x18;
  uint64_t uStack_a0;
  fiat_uint1 x17;
  uint64_t x16;
  uint64_t uStack_90;
  fiat_uint1 x15;
  uint64_t x14;
  uint64_t uStack_80;
  fiat_uint1 x13;
  uint64_t x12;
  uint64_t uStack_70;
  fiat_uint1 x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t uStack_58;
  fiat_uint1 x8;
  uint64_t x7;
  uint64_t uStack_48;
  fiat_uint1 x6;
  uint64_t x5;
  uint64_t uStack_38;
  fiat_uint1 x4;
  uint64_t x3;
  uint64_t uStack_28;
  fiat_uint1 x2;
  uint64_t x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg2;
  arg2_local = arg1;
  arg1_local = out1;
  fiat_addcarryx_u64(&stack0xffffffffffffffd8,(fiat_uint1 *)((long)&x3 + 7),'\0',*arg1,*arg2);
  fiat_addcarryx_u64(&stack0xffffffffffffffc8,(fiat_uint1 *)((long)&x5 + 7),x3._7_1_,arg2_local[1],
                     *(uint64_t *)(x1 + 8));
  fiat_addcarryx_u64(&stack0xffffffffffffffb8,(fiat_uint1 *)((long)&x7 + 7),x5._7_1_,arg2_local[2],
                     *(uint64_t *)(x1 + 0x10));
  fiat_addcarryx_u64(&stack0xffffffffffffffa8,(fiat_uint1 *)((long)&x9 + 7),x7._7_1_,arg2_local[3],
                     *(uint64_t *)(x1 + 0x18));
  fiat_cmovznz_u64(&x10,x9._7_1_,0,0x26);
  fiat_addcarryx_u64(&stack0xffffffffffffff90,(fiat_uint1 *)((long)&x12 + 7),'\0',uStack_28,x10);
  fiat_addcarryx_u64(&stack0xffffffffffffff80,(fiat_uint1 *)((long)&x14 + 7),x12._7_1_,uStack_38,0);
  fiat_addcarryx_u64(&stack0xffffffffffffff70,(fiat_uint1 *)((long)&x16 + 7),x14._7_1_,uStack_48,0);
  fiat_addcarryx_u64(&stack0xffffffffffffff60,(fiat_uint1 *)((long)&x18 + 7),x16._7_1_,uStack_58,0);
  fiat_cmovznz_u64(&x19,x18._7_1_,0,0x26);
  fiat_addcarryx_u64(&stack0xffffffffffffff48,&local_b9,'\0',uStack_70,x19);
  *arg1_local = uStack_b8;
  arg1_local[1] = uStack_80;
  arg1_local[2] = uStack_90;
  arg1_local[3] = uStack_a0;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_add(uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
  uint64_t x1;
  fiat_uint1 x2;
  uint64_t x3;
  fiat_uint1 x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  fiat_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  fiat_uint1 x11;
  uint64_t x12;
  fiat_uint1 x13;
  uint64_t x14;
  fiat_uint1 x15;
  uint64_t x16;
  fiat_uint1 x17;
  uint64_t x18;
  uint64_t x19;
  fiat_uint1 x20;
  fiat_addcarryx_u64(&x1, &x2, 0x0, (arg1[0]), (arg2[0]));
  fiat_addcarryx_u64(&x3, &x4, x2, (arg1[1]), (arg2[1]));
  fiat_addcarryx_u64(&x5, &x6, x4, (arg1[2]), (arg2[2]));
  fiat_addcarryx_u64(&x7, &x8, x6, (arg1[3]), (arg2[3]));
  fiat_cmovznz_u64(&x9, x8, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_addcarryx_u64(&x10, &x11, 0x0, x1, x9);
  fiat_addcarryx_u64(&x12, &x13, x11, x3, 0x0);
  fiat_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
  fiat_addcarryx_u64(&x16, &x17, x15, x7, 0x0);
  fiat_cmovznz_u64(&x18, x17, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_addcarryx_u64(&x19, &x20, 0x0, x10, x18);
  out1[0] = x19;
  out1[1] = x12;
  out1[2] = x14;
  out1[3] = x16;
}